

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_list.cpp
# Opt level: O2

OpenFileInfo * __thiscall
duckdb::GlobMultiFileList::GetFileInternal
          (OpenFileInfo *__return_storage_ptr__,GlobMultiFileList *this,idx_t i)

{
  bool bVar1;
  reference pvVar2;
  allocator local_49;
  string local_48;
  
  do {
    if (i < (ulong)(((long)(this->expanded_files).
                           super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                           .
                           super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->expanded_files).
                          super_vector<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>.
                          super__Vector_base<duckdb::OpenFileInfo,_std::allocator<duckdb::OpenFileInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x30)) {
      pvVar2 = vector<duckdb::OpenFileInfo,_true>::get<true>(&this->expanded_files,i);
      OpenFileInfo::OpenFileInfo(__return_storage_ptr__,pvVar2);
      return __return_storage_ptr__;
    }
    bVar1 = ExpandNextPath(this);
  } while (bVar1);
  ::std::__cxx11::string::string((string *)&local_48,anon_var_dwarf_4b71df5 + 9,&local_49);
  OpenFileInfo::OpenFileInfo(__return_storage_ptr__,&local_48);
  ::std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

OpenFileInfo GlobMultiFileList::GetFileInternal(idx_t i) {
	while (expanded_files.size() <= i) {
		if (!ExpandNextPath()) {
			return OpenFileInfo("");
		}
	}
	D_ASSERT(expanded_files.size() > i);
	return expanded_files[i];
}